

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      iVar1 = 0x1f;
      if ((number | 1U) != 0) {
        for (; (number | 1U) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      if ((this->field_0xa & 0x10) == 0) {
        uVar3 = MessageLite::ByteSize((this->field_0).message_value);
      }
      else {
        uVar3 = (*((this->field_0).message_value)->_vptr_MessageLite[10])();
      }
      iVar2 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = (ulong)(iVar1 * 9 + 0x49U >> 6) + 4 + (long)(int)uVar3 +
              (ulong)(iVar2 * 9 + 0x49U >> 6);
    }
    else {
      sVar4 = 0;
    }
    return sVar4;
  }
  sVar4 = ByteSize(this,number);
  return sVar4;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  size_t message_size = 0;
  if (is_lazy) {
    message_size = lazymessage_value->ByteSize();
  } else {
    message_size = message_value->ByteSize();
  }

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}